

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_get_int(uchar **p,uchar *end,int *val)

{
  uchar *puVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  size_t len;
  ulong local_18;
  
  puVar1 = *p;
  local_18 = (long)end - (long)puVar1;
  if ((long)local_18 < 1) {
    return -0x60;
  }
  iVar3 = -0x62;
  if (*puVar1 == '\x02') {
    *p = puVar1 + 1;
    iVar3 = mbedtls_asn1_get_len(p,end,&local_18);
    if (((iVar3 == 0) && (iVar3 = -100, local_18 < 5)) && (pbVar2 = *p, -1 < (char)*pbVar2)) {
      *val = 0;
      if (local_18 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = 0;
        uVar4 = 0;
        do {
          uVar4 = uVar4 << 8 | (uint)*pbVar2;
          *val = uVar4;
          *p = pbVar2 + 1;
          local_18 = local_18 - 1;
          pbVar2 = pbVar2 + 1;
        } while (local_18 != 0);
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_get_int( unsigned char **p,
                  const unsigned char *end,
                  int *val )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_INTEGER ) ) != 0 )
        return( ret );

    if( len > sizeof( int ) || ( **p & 0x80 ) != 0 )
        return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    *val = 0;

    while( len-- > 0 )
    {
        *val = ( *val << 8 ) | **p;
        (*p)++;
    }

    return( 0 );
}